

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3_test.c
# Opt level: O2

int sm3_test_case(void)

{
  char *__s;
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  uint8_t h2 [32];
  uint8_t h1 [32];
  
  uVar4 = 1;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x80) {
      puts("sm3 test case PASS ");
      return 1;
    }
    __s = *(char **)((long)&sm3_test_vec[0].in + lVar5);
    uVar1 = *(undefined8 *)((long)&sm3_test_vec[0].hash + lVar5);
    sVar3 = strlen(__s);
    SM3_once(__s,sVar3 & 0xffffffff,h1);
    hex_to_u8(uVar1,0x40,h2);
    iVar2 = bcmp(h1,h2,0x20);
    if (iVar2 != 0) break;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  printf("sm3 test case %d failed\n",(ulong)uVar4);
  return 0;
}

Assistant:

int sm3_test_case()
{
    int ret = GML_ERROR;
    uint8_t h1[32];
    uint8_t h2[32];

    for (int i = 0; i < sizeof(sm3_test_vec) / sizeof(SM3_TEST_VECTOR); i++) {
        SM3_once((uint8_t*)sm3_test_vec[i].in, strlen(sm3_test_vec[i].in), h1);
        hex_to_u8((uint8_t*)sm3_test_vec[i].hash, 64, h2);
        if (memcmp(h1, h2, 32) != 0) {
            printf("sm3 test case %d failed\n", i+1);
            goto end;
        }
    }

    printf("sm3 test case PASS \n");
    ret = GML_OK;
end:
    return ret;
}